

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memvar_propagation.hpp
# Opt level: O2

string * __thiscall
optimization::memvar_propagation::Memory_Var_Propagation::pass_name_abi_cxx11_
          (string *__return_storage_ptr__,Memory_Var_Propagation *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

std::string pass_name() const { return name; }